

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Unserialize<AutoFile,uint256,std::less<uint256>,std::allocator<uint256>>
               (AutoFile *is,set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *m)

{
  long lVar1;
  uint64_t uVar2;
  iterator __pos;
  int iVar3;
  long in_FS_OFFSET;
  uint256 key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::clear(&m->_M_t);
  uVar2 = ReadCompactSize<AutoFile>(is,true);
  __pos._M_node = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while (iVar3 = (int)uVar2, uVar2 = (uint64_t)(iVar3 - 1), iVar3 != 0) {
    key.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    key.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    base_blob<256U>::Unserialize<AutoFile>(&key.super_base_blob<256U>,is);
    __pos = std::
            _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
            ::_M_insert_unique_<uint256_const&>
                      ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                        *)m,__pos._M_node,&key);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::set<K, Pred, A>& m)
{
    m.clear();
    unsigned int nSize = ReadCompactSize(is);
    typename std::set<K, Pred, A>::iterator it = m.begin();
    for (unsigned int i = 0; i < nSize; i++)
    {
        K key;
        Unserialize(is, key);
        it = m.insert(it, key);
    }
}